

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> __thiscall
cppforth::Forth::GetFileHandle(Forth *this,Cell handler,string *function,errorCodes ec)

{
  pointer pFVar1;
  char cVar2;
  undefined8 uVar3;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Forth *this_00;
  errorCodes in_R8D;
  pointer pFVar4;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (Forth *)CONCAT44(in_register_00000034,handler);
  pFVar4 = (this_00->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this_00->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pFVar4 == pFVar1) {
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_register_0000000c,ec),": wrong file handler access");
      throwMessage(this_00,&local_50,in_R8D);
      std::__cxx11::string::~string((string *)&local_50);
      uVar3 = __cxa_rethrow();
      std::__cxx11::string::~string((string *)&local_50);
      _Unwind_Resume(uVar3);
    }
    if (pFVar4->FILE == (Cell)function) {
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::
        __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr((__shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        *)this,&(pFVar4->fileObject).
                                super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      );
        sVar5.
        super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = extraout_RDX._M_pi;
        sVar5.
        super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)this;
        return (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>)
               sVar5.
               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
      }
    }
    pFVar4 = pFVar4 + 1;
  } while( true );
}

Assistant:

std::shared_ptr<std::fstream> GetFileHandle(Cell handler, const std::string &function, errorCodes ec=errorAbort){
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it){
		if ((*it).FILE == handler && (*it).fileObject->is_open()){
			return (*it).fileObject;
		}
	}
	throwMessage(function + ": wrong file handler access",ec);
	throw;
}